

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

int parameter_set(char param,char id,longlong value64)

{
  int iVar1;
  undefined1 local_34;
  undefined1 uStack_2f;
  undefined1 uStack_2a;
  undefined1 uStack_25;
  char local_1f;
  char local_1e;
  undefined1 local_1d;
  int value;
  longlong lStack_18;
  char buf [7];
  longlong value64_local;
  char id_local;
  char param_local;
  
  lStack_18 = value64;
  if ((value64 < 0x80000000) && (-0x7fffffff < value64)) {
    iVar1 = option(OPTION_WITHOUT_DEVICE);
    if (iVar1 == 0) {
      uStack_25 = (undefined1)((ulong)value64 >> 0x18);
      local_1d = uStack_25;
      uStack_2a = (undefined1)((ulong)value64 >> 0x10);
      value._0_1_ = uStack_2a;
      uStack_2f = (undefined1)((ulong)value64 >> 8);
      value._1_1_ = uStack_2f;
      local_34 = (undefined1)value64;
      value._2_1_ = local_34;
      local_1f = param;
      local_1e = id;
      encode_write(&local_1f,6);
      value64_local._4_4_ = 0;
    }
    else {
      value64_local._4_4_ = 0;
    }
  }
  else {
    yprintf(OUTPUT_LV_ERROR,"ERROR: parameter out of range (id: %d)\n",(ulong)(uint)(int)param);
    value64_local._4_4_ = -1;
  }
  return value64_local._4_4_;
}

Assistant:

int parameter_set(char param, char id, long long int value64)
{
  char buf[7];
  int value;

  if (value64 > 0x7FFFFFFF || value64 < -0x7FFFFFFE)
  {
    yprintf(OUTPUT_LV_ERROR, "ERROR: parameter out of range (id: %d)\n", param);
    return -1;
  }
  value = value64;

  if (option(OPTION_WITHOUT_DEVICE))
  {
    return (0);
  }

  buf[0] = param;
  buf[1] = id;
  buf[2] = ((Int_4Char)value).byte[3];
  buf[3] = ((Int_4Char)value).byte[2];
  buf[4] = ((Int_4Char)value).byte[1];
  buf[5] = ((Int_4Char)value).byte[0];
  encode_write(buf, 6);

  return (0);
}